

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O1

void __thiscall
ezc3d::c3d::analog(c3d *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *chanNames,
                  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *frames)

{
  pointer pFVar1;
  pointer pFVar2;
  int iVar3;
  size_t sVar4;
  Analogs *pAVar5;
  size_t sVar6;
  SubFrame *pSVar7;
  Frame *this_00;
  SubFrame *this_01;
  Channel *channel;
  invalid_argument *piVar8;
  size_t sf;
  ulong idx;
  size_t f;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pFVar1 = (frames->super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2 = (frames->super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = DataNS::Data::nbFrames
                    ((this->_data).
                     super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (((long)pFVar1 - (long)pFVar2 >> 4) * -0x5555555555555555 - sVar4 == 0) {
    pAVar5 = DataNS::Frame::analogs
                       ((frames->
                        super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    sVar4 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar5);
    sVar6 = Header::nbAnalogByFrame
                      ((this->_header).super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar4 == sVar6) {
      local_50 = frames;
      pAVar5 = DataNS::Frame::analogs
                         ((frames->
                          super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      pSVar7 = DataNS::AnalogsNS::Analogs::subframe(pAVar5,0);
      sVar4 = DataNS::AnalogsNS::SubFrame::nbChannels(pSVar7);
      if (sVar4 != 0) {
        channelNames_abi_cxx11_(&local_68,this);
        if ((chanNames->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (chanNames->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          sVar4 = 0;
          do {
            if (local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar9 = 0;
              do {
                iVar3 = std::__cxx11::string::compare
                                  ((string *)
                                   ((chanNames->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + sVar4));
                if (iVar3 == 0) {
                  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar8,"The channel you try to create already exists in the data set");
                  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < (ulong)((long)local_68.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_68.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            uVar9 = 0;
            while( true ) {
              sVar6 = DataNS::Data::nbFrames
                                ((this->_data).
                                 super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
              if (sVar6 <= uVar9) break;
              idx = 0;
              while( true ) {
                sVar6 = Header::nbAnalogByFrame
                                  ((this->_header).
                                   super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
                if (sVar6 <= idx) break;
                this_00 = DataNS::Data::frame((this->_data).
                                              super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr,uVar9);
                pAVar5 = DataNS::Frame::analogs(this_00);
                pSVar7 = DataNS::AnalogsNS::Analogs::subframe(pAVar5,idx);
                pAVar5 = DataNS::Frame::analogs
                                   ((local_50->
                                    super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9);
                this_01 = DataNS::AnalogsNS::Analogs::subframe(pAVar5,idx);
                channel = DataNS::AnalogsNS::SubFrame::channel(this_01,sVar4);
                DataNS::AnalogsNS::SubFrame::channel(pSVar7,channel,0xffffffffffffffff);
                idx = idx + 1;
              }
              uVar9 = uVar9 + 1;
            }
            sVar4 = sVar4 + 1;
          } while (sVar4 < (ulong)((long)(chanNames->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(chanNames->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        updateParameters(this,&local_48,chanNames);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        return;
      }
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Channels in the frame cannot be empty");
    }
    else {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar8,
                 "Size of the subframes in the frames must equal the number of subframes already present in the data set"
                );
    }
  }
  else {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,
               "Size of the array of frames must equal the number of frames already present in the data set"
              );
  }
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ezc3d::c3d::analog(const std::vector<std::string> &chanNames,
                        const std::vector<ezc3d::DataNS::Frame> &frames) {
  if (frames.size() != data().nbFrames())
    throw std::invalid_argument(
        "Size of the array of frames must equal the number of "
        "frames already present in the data set");
  if (frames[0].analogs().nbSubframes() != header().nbAnalogByFrame())
    throw std::invalid_argument(
        "Size of the subframes in the frames must equal the "
        "number of subframes already present in the data set");
  if (frames[0].analogs().subframe(0).nbChannels() == 0)
    throw std::invalid_argument("Channels in the frame cannot be empty");

  const std::vector<std::string> &labels(channelNames());
  for (size_t idx = 0; idx < chanNames.size(); ++idx) {
    for (size_t i = 0; i < labels.size(); ++i)
      if (!chanNames[idx].compare(labels[i]))
        throw std::invalid_argument("The channel you try to create already "
                                    "exists in the data set");

    for (size_t f = 0; f < data().nbFrames(); ++f) {
      for (size_t sf = 0; sf < header().nbAnalogByFrame(); ++sf) {
        _data->frame(f).analogs().subframe(sf).channel(
            frames[f].analogs().subframe(sf).channel(idx));
      }
    }
  }
  updateParameters({}, chanNames);
}